

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O1

uint64_t pow_mod_p(uint64_t a,uint64_t b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = a;
  if (b != 1) {
    uVar1 = pow_mod_p(a,b >> 1);
    uVar2 = 0;
    uVar3 = uVar1;
    if (uVar1 != 0) {
      do {
        if ((uVar3 & 1) != 0) {
          uVar4 = uVar1 + 0x3b;
          if (uVar2 < -uVar1 - 0x3b) {
            uVar4 = uVar1;
          }
          uVar2 = uVar2 + uVar4;
        }
        uVar4 = uVar1 * 2;
        bVar5 = uVar1 < -uVar1 - 0x3b;
        uVar1 = uVar1 * 2 + 0x3b;
        if (bVar5) {
          uVar1 = uVar4;
        }
        bVar5 = 1 < uVar3;
        uVar3 = uVar3 >> 1;
      } while (bVar5);
    }
    uVar1 = uVar2;
    if (((b & 1) != 0) && (uVar1 = 0, a != 0)) {
      do {
        if ((a & 1) != 0) {
          uVar3 = uVar2 + 0x3b;
          if (uVar1 < -uVar2 - 0x3b) {
            uVar3 = uVar2;
          }
          uVar1 = uVar1 + uVar3;
        }
        uVar3 = uVar2 * 2;
        bVar5 = uVar2 < -uVar2 - 0x3b;
        uVar2 = uVar2 * 2 + 0x3b;
        if (bVar5) {
          uVar2 = uVar3;
        }
        bVar5 = 1 < a;
        a = a >> 1;
      } while (bVar5);
    }
  }
  return uVar1;
}

Assistant:

static inline uint64_t
pow_mod_p(uint64_t a, uint64_t b) {
	if (b==1) {
		return a;
	}
	uint64_t t = pow_mod_p(a, b>>1);
	t = mul_mod_p(t,t);
	if (b % 2) {
		t = mul_mod_p(t, a);
	}
	return t;
}